

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_buffer_manager.cpp
# Opt level: O2

void __thiscall duckdb::StandardBufferManager::~StandardBufferManager(StandardBufferManager *this)

{
  ~StandardBufferManager(this);
  operator_delete(this);
  return;
}

Assistant:

StandardBufferManager::~StandardBufferManager() {
}